

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<long,_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>::
     ModulusSimpleCase(long lhs,
                      SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
                      SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  long lVar2;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RSI;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  int in_stack_ffffffffffffffbc;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffc0;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffc8;
  
  bVar1 = ::operator!=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>::
            SignedCase(in_stack_ffffffffffffffc8,
                       (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       in_stack_ffffffffffffffc0.m_int);
    if (!bVar1) {
      lVar2 = ::SafeInt::operator_cast_to_long(in_RDI);
      SafeInt<long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                (in_RSI,(long *)((long)in_RDI % lVar2));
    }
    return true;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }